

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::c_input_test_10doubles::test(c_input_test_10doubles *this)

{
  undefined8 uVar1;
  undefined8 in_R9;
  undefined8 uVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_478;
  undefined8 local_468;
  uint64_t res2;
  undefined8 local_450;
  uint64_t res;
  fun_ptr f;
  uint64_t size;
  first_pass_data d;
  logic_error e;
  undefined1 local_3b8 [56];
  asmcode code;
  allocator<char> local_351;
  string local_350 [6];
  bool error;
  string script;
  stringstream local_320 [8];
  stringstream str2;
  undefined1 local_310 [376];
  stringstream local_198 [8];
  stringstream str;
  undefined1 local_188 [376];
  c_input_test_10doubles *local_10;
  c_input_test_10doubles *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  std::__cxx11::stringstream::stringstream(local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,
             "\n(c-input \"(double a, double b, double c, double d, double e, double f, double g, double h, double i, double j) \" )\n\n(+ a b c d e f g h i j)\n"
             ,&local_351);
  std::allocator<char>::~allocator(&local_351);
  assembler::asmcode::asmcode((asmcode *)(local_3b8 + 0x30));
  compile_fixture::get_asmcode((compile_fixture *)local_3b8,(string *)this);
  assembler::asmcode::operator=((asmcode *)(local_3b8 + 0x30),(asmcode *)local_3b8);
  assembler::asmcode::~asmcode((asmcode *)local_3b8);
  assembler::first_pass_data::first_pass_data((first_pass_data *)&size);
  res = assembler::assemble((ulong *)&f,(first_pass_data *)&size,(asmcode *)(local_3b8 + 0x30));
  if ((code *)res != (code *)0x0) {
    uVar3 = 0x4024000000000000;
    uVar2 = 0x4023cccccccccccd;
    uVar1 = (*(code *)res)(0x3ff199999999999a,0x400199999999999a,0x400a666666666666,
                           0x401199999999999a,0x4016000000000000,0x401a666666666666,
                           0x401ecccccccccccd,&(this->super_compile_fixture).ctxt);
    local_450 = uVar1;
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&res2,
               &(this->super_compile_fixture).env);
    skiwi::scheme_runtime
              (uVar1,local_188,(shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&res2,
               &(this->super_compile_fixture).rd,0,in_R9,uVar2,uVar3);
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&res2);
    uVar3 = 0x4012000000000000;
    uVar2 = 0x405947df3b645a1d;
    uVar1 = (*(code *)res)(0,0,0,0,0,0,0,&(this->super_compile_fixture).ctxt);
    local_468 = uVar1;
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr
              (&local_478,&(this->super_compile_fixture).env);
    skiwi::scheme_runtime
              (uVar1,local_310,&local_478,&(this->super_compile_fixture).rd,0,in_R9,uVar2,uVar3);
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr(&local_478);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&(this->super_compile_fixture).compiled_functions,
               (_func_unsigned_long_void_ptr_varargs **)&res,(unsigned_long *)&f);
  }
  assembler::first_pass_data::~first_pass_data((first_pass_data *)&size);
  std::__cxx11::stringstream::str();
  TestEq<char_const*,std::__cxx11::string>
            ("59.5",&local_498,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x162d,"void skiwi::(anonymous namespace)::c_input_test_10doubles::test()");
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::stringstream::str();
  TestEq<char_const*,std::__cxx11::string>
            ("105.623",&local_4b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x162e,"void skiwi::(anonymous namespace)::c_input_test_10doubles::test()");
  std::__cxx11::string::~string((string *)&local_4b8);
  assembler::asmcode::~asmcode((asmcode *)(local_3b8 + 0x30));
  std::__cxx11::string::~string(local_350);
  std::__cxx11::stringstream::~stringstream(local_320);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void test()
      {
      std::stringstream str, str2;
      std::string script = R"(
(c-input "(double a, double b, double c, double d, double e, double f, double g, double h, double i, double j) " )

(+ a b c d e f g h i j)
)";
      bool error = false;
      asmcode code;
      try
        {
        code = get_asmcode(script);
        }
      catch (std::logic_error e)
        {
        error = true;
        str << e.what();
        }
      if (!error)
        {
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        if (f)
          {
          uint64_t res = f(&ctxt, 1.1, 2.2, 3.3, 4.4, 5.5, 6.6, 7.7, 8.8, 9.9, 10.0);
          scheme_runtime(res, str, env, rd, nullptr);

          uint64_t res2 = f(&ctxt, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 101.123, 4.5);
          scheme_runtime(res2, str2, env, rd, nullptr);

          compiled_functions.emplace_back(f, size);
          }
        }
      TEST_EQ("59.5", str.str());
      TEST_EQ("105.623", str2.str());
      }